

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMisc.cpp
# Opt level: O0

int Imf_2_5::getScanlineChunkOffsetTableSize(Header *header)

{
  int iVar1;
  Box2i *pBVar2;
  int lineOffsetSize;
  int linesInBuffer;
  Box2i *dataWindow;
  
  pBVar2 = Header::dataWindow((Header *)0x289923);
  Header::compression((Header *)0x289932);
  iVar1 = anon_unknown_4::numLinesInBuffer((Compression)pBVar2);
  return (((pBVar2->max).y - (pBVar2->min).y) + iVar1) / iVar1;
}

Assistant:

int
getScanlineChunkOffsetTableSize(const Header& header)
{
    const Box2i &dataWindow = header.dataWindow();

    int linesInBuffer = numLinesInBuffer ( header.compression() );

    int lineOffsetSize = (dataWindow.max.y - dataWindow.min.y +
                          linesInBuffer) / linesInBuffer;

    return lineOffsetSize;
}